

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O2

void __thiscall cppjieba::KeywordExtractor::LoadIdfDict(KeywordExtractor *this,string *idfPath)

{
  uint __line;
  pointer __k;
  char cVar1;
  ostream *poVar2;
  istream *piVar3;
  mapped_type *pmVar4;
  char *__assertion;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  allocator local_419;
  double local_418;
  KeywordExtractor *local_410;
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *local_408;
  double local_400;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  buf;
  string line;
  Logger local_3b8;
  ifstream ifs;
  
  std::ifstream::ifstream(&ifs,(idfPath->_M_dataplus)._M_p,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 == '\0') {
    limonp::Logger::Logger
              (&local_3b8,4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/KeywordExtractor.hpp"
               ,0x61);
    poVar2 = std::operator<<((ostream *)&local_3b8,"exp: [ifs.is_open()");
    poVar2 = std::operator<<(poVar2,"] false. ");
    poVar2 = std::operator<<(poVar2,"open ");
    poVar2 = std::operator<<(poVar2,(string *)idfPath);
    std::operator<<(poVar2," failed");
    limonp::Logger::~Logger(&local_3b8);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  buf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  buf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  buf.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_408 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)&this->idfMap_;
  local_418 = 0.0;
  lVar5 = 0;
  local_410 = this;
  do {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ifs,(string *)&line);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) {
      if (lVar5 == 0) {
        __assertion = "lineno";
        __line = 0x78;
      }
      else {
        auVar6._8_4_ = (int)((ulong)lVar5 >> 0x20);
        auVar6._0_8_ = lVar5;
        auVar6._12_4_ = 0x45300000;
        dVar7 = local_418 /
                ((auVar6._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0));
        local_410->idfAverage_ = dVar7;
        if (0.0 < dVar7) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&buf);
          std::__cxx11::string::~string((string *)&line);
          std::ifstream::~ifstream(&ifs);
          return;
        }
        __assertion = "idfAverage_ > 0.0";
        __line = 0x7a;
      }
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/KeywordExtractor.hpp"
                    ,__line,"void cppjieba::KeywordExtractor::LoadIdfDict(const string &)");
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear(&buf);
    if (line._M_string_length == 0) {
      limonp::Logger::Logger
                (&local_3b8,3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/KeywordExtractor.hpp"
                 ,0x6a);
      poVar2 = std::operator<<((ostream *)&local_3b8,"lineno: ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      std::operator<<(poVar2," empty. skipped.");
LAB_0011e555:
      limonp::Logger::~Logger(&local_3b8);
    }
    else {
      std::__cxx11::string::string((string *)&local_3b8," ",&local_419);
      limonp::Split(&line,&buf,(string *)&local_3b8,0xffffffffffffffff);
      std::__cxx11::string::~string((string *)&local_3b8);
      __k = buf.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if ((long)buf.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)buf.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0x40) {
        limonp::Logger::Logger
                  (&local_3b8,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/KeywordExtractor.hpp"
                   ,0x6f);
        poVar2 = std::operator<<((ostream *)&local_3b8,"line: ");
        poVar2 = std::operator<<(poVar2,(string *)&line);
        poVar2 = std::operator<<(poVar2,", lineno: ");
        poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
        std::operator<<(poVar2," empty. skipped.");
        goto LAB_0011e555;
      }
      local_400 = atof(buf.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
      pmVar4 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[](local_408,__k);
      *pmVar4 = local_400;
      local_418 = local_418 + local_400;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void LoadIdfDict(const string& idfPath) {
    ifstream ifs(idfPath.c_str());
    XCHECK(ifs.is_open()) << "open " << idfPath << " failed";
    string line ;
    vector<string> buf;
    double idf = 0.0;
    double idfSum = 0.0;
    size_t lineno = 0;
    for (; getline(ifs, line); lineno++) {
      buf.clear();
      if (line.empty()) {
        XLOG(ERROR) << "lineno: " << lineno << " empty. skipped.";
        continue;
      }
      Split(line, buf, " ");
      if (buf.size() != 2) {
        XLOG(ERROR) << "line: " << line << ", lineno: " << lineno << " empty. skipped.";
        continue;
      }
      idf = atof(buf[1].c_str());
      idfMap_[buf[0]] = idf;
      idfSum += idf;

    }

    assert(lineno);
    idfAverage_ = idfSum / lineno;
    assert(idfAverage_ > 0.0);
  }